

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

int lodepng::getPaletteValue(uchar *data,size_t i,int bits)

{
  int bits_local;
  size_t i_local;
  uchar *data_local;
  uint local_4;
  
  if (bits == 8) {
    local_4 = (uint)data[i];
  }
  else if (bits == 4) {
    local_4 = (int)(uint)data[i >> 1] >> (sbyte)((i & 1) << 2) & 0xf;
  }
  else if (bits == 2) {
    local_4 = (int)(uint)data[i >> 2] >> (sbyte)((i & 3) << 1) & 3;
  }
  else if (bits == 1) {
    local_4 = (int)(uint)data[i >> 3] >> ((byte)i & 7) & 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int getPaletteValue(const unsigned char* data, size_t i, int bits) {
  if(bits == 8) return data[i];
  else if(bits == 4) return (data[i / 2] >> ((i % 2) * 4)) & 15;
  else if(bits == 2) return (data[i / 4] >> ((i % 4) * 2)) & 3;
  else if(bits == 1) return (data[i / 8] >> (i % 8)) & 1;
  else return 0;
}